

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O1

void __thiscall duckdb::BindContext::AddContext(BindContext *this,BindContext *other)

{
  pointer puVar1;
  __hashtable *__h;
  _Hash_node_base *p_Var2;
  pointer puVar3;
  _Hash_node_base *p_Var4;
  _Head_base<0UL,_duckdb::Binding_*,_false> local_40;
  _Hashtable<std::reference_wrapper<duckdb::UsingColumnSet>,std::reference_wrapper<duckdb::UsingColumnSet>,std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::UsingColumnSet>,duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_38;
  
  puVar3 = (other->bindings_list).
           super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (other->bindings_list).
           super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar1) {
    do {
      local_40._M_head_impl =
           (puVar3->super_unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_>)._M_t.
           super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>.
           super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl;
      (puVar3->super_unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>.
      super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl = (Binding *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>,std::allocator<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>>
      ::emplace_back<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>,std::allocator<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>>
                  *)&this->bindings_list,
                 (unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *)
                 &local_40);
      if (local_40._M_head_impl != (Binding *)0x0) {
        (*(local_40._M_head_impl)->_vptr_Binding[1])();
      }
      local_40._M_head_impl = (Binding *)0x0;
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  p_Var4 = (other->using_columns)._M_h._M_before_begin._M_nxt;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    do {
      p_Var2 = p_Var4[7]._M_nxt;
      if (p_Var2 != (_Hash_node_base *)0x0) {
        do {
          local_38 = (_Hashtable<std::reference_wrapper<duckdb::UsingColumnSet>,std::reference_wrapper<duckdb::UsingColumnSet>,std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::UsingColumnSet>,duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)::std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&this->using_columns,(key_type *)(p_Var4 + 1));
          ::std::
          _Hashtable<std::reference_wrapper<duckdb::UsingColumnSet>,std::reference_wrapper<duckdb::UsingColumnSet>,std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::UsingColumnSet>,duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<std::reference_wrapper<duckdb::UsingColumnSet>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::reference_wrapper<duckdb::UsingColumnSet>,true>>>>
                    (local_38,p_Var2 + 1,&local_38);
          p_Var2 = p_Var2->_M_nxt;
        } while (p_Var2 != (_Hash_node_base *)0x0);
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void BindContext::AddContext(BindContext other) {
	for (auto &binding : other.bindings_list) {
		AddBinding(std::move(binding));
	}
	for (auto &entry : other.using_columns) {
		for (auto &alias : entry.second) {
			using_columns[entry.first].insert(alias);
		}
	}
}